

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O1

void __thiscall LinkedList::deletion(LinkedList *this,Node **head,int number)

{
  Node *pNVar1;
  Node *pNVar2;
  Node **ppNVar3;
  Node *pNVar4;
  
  pNVar1 = *head;
  if (pNVar1 == (Node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Empty Linked List",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    return;
  }
  if (pNVar1->next == (Node *)0x0) {
    operator_delete(pNVar1,0x10);
    *head = (Node *)0x0;
  }
  else {
    if (pNVar1->data == number) {
      *head = pNVar1->next;
      operator_delete(pNVar1,0x10);
      return;
    }
    pNVar2 = pNVar1->next;
    while (pNVar4 = pNVar2, pNVar4 != (Node *)0x0) {
      ppNVar3 = &pNVar1->next;
      while (pNVar1 = pNVar4, pNVar2 = pNVar4->next, pNVar4->data == number) {
        *ppNVar3 = pNVar4->next;
        operator_delete(pNVar4,0x10);
        pNVar4 = *ppNVar3;
        if (pNVar4 == (Node *)0x0) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void LinkedList::deletion(Node** head, int number) {
	Node* last = *head;
	Node* next = nullptr;

	// Check if any node exists in linked list
	if (last == NULL) {
		std::cout << "Empty Linked List" << std::endl;
		return;
	}

	// Check if only one node is in linked list
	if (last->next == nullptr) {
		freeUpMemory(head);
		return;
	}

	// Check if node to delete is first node
	if (last->data == number) {
		*head = last->next;
		freeUpMemory(&last);
		return;
	}

	// Loop through and find node to delete
	while (last->next != nullptr) {
		next = last->next;
		if (next->data == number) {
			if (next->next == nullptr) {
				last->next = nullptr;
			} else {
				last->next = next->next;
			}
			freeUpMemory(&next);
		}
		else {
			last = last->next;
			continue;
		}
	}
}